

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O2

void p2sc_spawn_many(char **cmd,int num)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  char *fmt;
  ulong uVar4;
  int status;
  GError *err;
  gint argc;
  
  err = (GError *)0x0;
  lVar2 = g_malloc((long)num * 4);
  uVar3 = 0;
  uVar4 = (ulong)(uint)num;
  if (num < 1) {
    uVar4 = uVar3;
  }
  while( true ) {
    if (uVar4 * 4 - uVar3 == 0) {
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        waitpid(*(__pid_t *)(lVar2 + uVar3 * 4),&status,0);
        g_spawn_close_pid(*(undefined4 *)(lVar2 + uVar3 * 4));
      }
      g_free(lVar2);
      return;
    }
    iVar1 = g_shell_parse_argv(*(undefined8 *)((long)cmd + uVar3 * 2),&argc,&status,&err);
    if (iVar1 == 0) break;
    iVar1 = g_spawn_async(0,_status,0,0x1e,0,0);
    if (iVar1 == 0) {
      if ((err == (GError *)0x0) || (err->message == (gchar *)0x0)) {
        fmt = "spawn_aync(%s): unknown failure";
        iVar1 = 0xcd;
      }
      else {
        fmt = "spawn_async(%s): %s";
        iVar1 = 0xca;
      }
      goto LAB_00116381;
    }
    g_strfreev(_status);
    uVar3 = uVar3 + 4;
  }
  if ((err == (GError *)0x0) || (err->message == (gchar *)0x0)) {
    fmt = "shell_parse_argv(%s): unknown failure";
    iVar1 = 0xc1;
  }
  else {
    fmt = "shell_parse_argv(%s): %s";
    iVar1 = 0xbe;
  }
LAB_00116381:
  _p2sc_msg("p2sc_spawn_many",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
            ,iVar1,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,fmt,
            *(undefined8 *)((long)cmd + uVar3 * 2));
  exit(1);
}

Assistant:

void p2sc_spawn_many(const char **cmd, int num) {
    int i, status;
    GError *err = NULL;
    GPid *pid = (GPid *) g_malloc(num * sizeof *pid);

    for (i = 0; i < num; ++i) {
        gint argc;
        gchar **argv;

        if (!g_shell_parse_argv(cmd[i], &argc, &argv, &err)) {
            if (err && err->message) {
                P2SC_Msg(LVL_FATAL, "shell_parse_argv(%s): %s", cmd[i], err->message);
                g_error_free(err);
            } else
                P2SC_Msg(LVL_FATAL, "shell_parse_argv(%s): unknown failure", cmd[i]);
        }

        if (!g_spawn_async(NULL, argv, NULL,
                           (GSpawnFlags) (G_SPAWN_SEARCH_PATH |
                                          G_SPAWN_STDOUT_TO_DEV_NULL |
                                          G_SPAWN_STDERR_TO_DEV_NULL |
                                          G_SPAWN_DO_NOT_REAP_CHILD), NULL, NULL, pid + i, &err)) {
            if (err && err->message) {
                P2SC_Msg(LVL_FATAL, "spawn_async(%s): %s", cmd[i], err->message);
                g_error_free(err);
            } else
                P2SC_Msg(LVL_FATAL, "spawn_aync(%s): unknown failure", cmd[i]);
        }

        g_strfreev(argv);
    }
    /* wait for our children */
    for (i = 0; i < num; ++i) {
        waitpid(pid[i], &status, 0);
        g_spawn_close_pid(pid[i]);
    }

    g_free(pid);
}